

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::print_const_constructor
          (t_netstd_generator *this,ostream *out,
          vector<t_const_*,_std::allocator<t_const_*>_> *consts)

{
  vector<t_const_*,_std::allocator<t_const_*>_> *out_00;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  reference pptVar4;
  string local_d8;
  t_const_value *local_b8;
  t_const_value *value;
  t_type *type;
  string name;
  __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_> local_78;
  iterator c_iter;
  string local_40;
  vector<t_const_*,_std::allocator<t_const_*>_> *local_20;
  vector<t_const_*,_std::allocator<t_const_*>_> *consts_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_20 = consts;
  consts_local = (vector<t_const_*,_std::allocator<t_const_*>_> *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&local_40);
  poVar2 = std::operator<<(poVar2,"static ");
  make_valid_csharp_identifier
            ((string *)&c_iter,this,&(this->super_t_oop_generator).super_t_generator.program_name_);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"Constants()");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&c_iter);
  std::__cxx11::string::~string((string *)&local_40);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)consts_local);
  __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
  __normal_iterator(&local_78);
  local_78._M_current =
       (t_const **)std::vector<t_const_*,_std::allocator<t_const_*>_>::begin(consts);
  while( true ) {
    name.field_2._8_8_ = std::vector<t_const_*,_std::allocator<t_const_*>_>::end(consts);
    bVar1 = __gnu_cxx::operator!=
                      (&local_78,
                       (__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
                        *)((long)&name.field_2 + 8));
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
              operator*(&local_78);
    t_const::get_name_abi_cxx11_((string *)&type,*pptVar4);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
              operator*(&local_78);
    value = (t_const_value *)t_const::get_type(*pptVar4);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
              operator*(&local_78);
    local_b8 = t_const::get_value(*pptVar4);
    out_00 = consts_local;
    std::__cxx11::string::string((string *)&local_d8,(string *)&type);
    print_const_def_value(this,(ostream *)out_00,&local_d8,(t_type *)value,local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&type);
    __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
    operator++(&local_78);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)consts_local);
  return;
}

Assistant:

void t_netstd_generator::print_const_constructor(ostream& out, vector<t_const*> consts)
{
    out << indent() << "static " << make_valid_csharp_identifier(program_name_).c_str() << "Constants()" << endl;
    scope_up(out);

    vector<t_const*>::iterator c_iter;
    for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter)
    {
        string name = (*c_iter)->get_name();
        t_type* type = (*c_iter)->get_type();
        t_const_value* value = (*c_iter)->get_value();

        print_const_def_value(out, name, type, value);
    }
    scope_down(out);
}